

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmFor::gen_code(CTPNStmFor *this,int param_2,int param_3)

{
  undefined8 *puVar1;
  char **ppcVar2;
  CTcPrsSymtab *pCVar3;
  CTPNStmEnclosing *stm;
  CTcCodeLabel *pCVar4;
  CTcCodeLabel *pCVar5;
  CTcCodeStream *this_00;
  CTcCodeStream *in_RDI;
  CTPNForIn *i_1;
  CTPNForIn *i;
  CTcPrsSymtab *old_frame;
  CTPNStmEnclosing *old_enclosing;
  CTcCodeLabel *cont_lbl;
  CTcCodeLabel *end_lbl;
  CTcCodeLabel *top_lbl;
  uchar in_stack_0000009f;
  CTcGenTarg *in_stack_000000a0;
  CTcCodeLabel *in_stack_ffffffffffffffa8;
  CTcPrsSymtab *in_stack_ffffffffffffffb8;
  CTcCodeStream *in_stack_ffffffffffffffc0;
  
  pCVar3 = CTcCodeStream::set_local_frame(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI);
  stm = CTcCodeStream::set_enclosing(G_cs,(CTPNStmEnclosing *)in_RDI);
  if ((in_RDI->super_CTcDataStream).page_cur_ != 0) {
    puVar1 = (undefined8 *)(in_RDI->super_CTcDataStream).page_cur_;
    (**(code **)*puVar1)(puVar1,1);
  }
  CTcPrsNode::new_label_here();
  pCVar4 = CTcCodeStream::new_label_fwd(in_RDI);
  pCVar5 = CTcCodeStream::new_label_fwd(in_RDI);
  for (this_00 = (CTcCodeStream *)(in_RDI->super_CTcDataStream).page_cnt_;
      this_00 != (CTcCodeStream *)0x0;
      this_00 = (CTcCodeStream *)CTPNForInBase::getnxt((CTPNForInBase *)this_00)) {
    (*(((CTcPrsNode *)&(this_00->super_CTcDataStream)._vptr_CTcDataStream)->super_CTcPrsNodeBase).
      _vptr_CTcPrsNodeBase[0x1a])(this_00,pCVar5);
  }
  if ((in_RDI->super_CTcDataStream).pages_ != (char **)0x0) {
    ppcVar2 = (in_RDI->super_CTcDataStream).pages_;
    (**(code **)(*ppcVar2 + 0xa0))(ppcVar2,0,pCVar5);
  }
  *(CTcCodeLabel **)&(in_RDI->super_CTcDataStream).stream_id_ = pCVar5;
  in_RDI->active_lbl_ = pCVar4;
  if ((in_RDI->super_CTcDataStream).first_anchor_ != (CTcStreamAnchor *)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)stm,(CTPNStm *)pCVar3);
  }
  CTcPrsNode::def_label_pos((CTcCodeLabel *)this_00);
  if ((in_RDI->super_CTcDataStream).page_slots_ != 0) {
    puVar1 = (undefined8 *)(in_RDI->super_CTcDataStream).page_slots_;
    (**(code **)*puVar1)(puVar1,1);
  }
  for (pCVar3 = (CTcPrsSymtab *)(in_RDI->super_CTcDataStream).page_cnt_;
      pCVar3 != (CTcPrsSymtab *)0x0;
      pCVar3 = (CTcPrsSymtab *)CTPNForInBase::getnxt((CTPNForInBase *)pCVar3)) {
    (*(((CTPNForInBase *)&pCVar3->_vptr_CTcPrsSymtab)->super_CTcPrsNode).super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0x1b])();
  }
  CTcGenTarg::write_op(in_stack_000000a0,in_stack_0000009f);
  CTcCodeStream::write_ofs2(in_RDI,in_stack_ffffffffffffffa8,0);
  CTcPrsNode::def_label_pos((CTcCodeLabel *)this_00);
  CTcCodeStream::set_enclosing(G_cs,stm);
  CTcCodeStream::set_local_frame(this_00,pCVar3);
  return;
}

Assistant:

void CTPNStmFor::gen_code(int, int)
{
    CTcCodeLabel *top_lbl;
    CTcCodeLabel *end_lbl;
    CTcCodeLabel *cont_lbl;
    CTPNStmEnclosing *old_enclosing;
    CTcPrsSymtab *old_frame;

    /* set my local frame if necessary */
    old_frame = G_cs->set_local_frame(symtab_);

    /* 
     *   add a line record - note that we add the line record after
     *   setting up the local frame, so that the 'for' statement itself
     *   appears within its own inner scope 
     */
    add_debug_line_rec();

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);
    
    /* if there's an initializer expression, generate it */
    if (init_expr_ != 0)
        init_expr_->gen_code(TRUE, TRUE);

    /* set the label for the top of the loop */
    top_lbl = new_label_here();

    /* allocate a forward label for 'continue' jumps */
    cont_lbl = G_cs->new_label_fwd();

    /* allocate a forward label for the end of the loop */
    end_lbl = G_cs->new_label_fwd();

    /* generate the implicit conditions for any 'in' clauses */
    for (CTPNForIn *i = in_exprs_ ; i != 0 ; i = i->getnxt())
        i->gen_forstm_cond(end_lbl);

    /* 
     *   If there's an explicit condition clause, generate its code, jumping
     *   to the end of the loop if the condition is false.  
     */
    if (cond_expr_ != 0)
        cond_expr_->gen_code_cond(0, end_lbl);

    /* 
     *   set our labels, so that 'break' and 'continue' statements in our
     *   body will know where to go 
     */
    break_lbl_ = end_lbl;
    cont_lbl_ = cont_lbl;

    /* if we have a body, generate it */
    if (body_stm_ != 0)
        gen_code_substm(body_stm_);

    /* 
     *   add another line record - we're now generating code again for the
     *   original 'for' line, even though it's after the body 
     */
//$$$    add_debug_line_rec();

    /* this is where we come for 'continue' statements */
    def_label_pos(cont_lbl);

    /* generate the reinitializer expression, if we have one */
    if (reinit_expr_ != 0)
        reinit_expr_->gen_code(TRUE, TRUE);

    /* generate the implicit reinitializers for any 'in' clauses */
    for (CTPNForIn *i = in_exprs_ ; i != 0 ; i = i->getnxt())
        i->gen_forstm_reinit();

    /* jump back to the top of the loop */
    G_cg->write_op(OPC_JMP);
    G_cs->write_ofs2(top_lbl, 0);

    /* 
     *   we're at the end of the loop - this is where we jump for 'break'
     *   and when the condition becomes false 
     */
    def_label_pos(end_lbl);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);

    /* restore the enclosing local scope */
    G_cs->set_local_frame(old_frame);
}